

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_avx2.c
# Opt level: O1

void av1_lowbd_fwd_txfm_avx2
               (int16_t *src_diff,tran_low_t *coeff,int diff_stride,TxfmParam *txfm_param)

{
  if (((ulong)txfm_param->tx_size == 0) && (txfm_param->lossless != 0)) {
    av1_lowbd_fwd_txfm_c(src_diff,coeff,diff_stride,txfm_param);
    return;
  }
  (*fwd_txfm2d_func_ls[txfm_param->tx_size])
            (src_diff,coeff,diff_stride,txfm_param->tx_type,txfm_param->bd);
  return;
}

Assistant:

void av1_lowbd_fwd_txfm_avx2(const int16_t *src_diff, tran_low_t *coeff,
                             int diff_stride, TxfmParam *txfm_param) {
  FwdTxfm2dFunc fwd_txfm2d_func = fwd_txfm2d_func_ls[txfm_param->tx_size];
  if (txfm_param->lossless && txfm_param->tx_size == TX_4X4) {
    av1_lowbd_fwd_txfm_c(src_diff, coeff, diff_stride, txfm_param);
  } else {
    fwd_txfm2d_func(src_diff, coeff, diff_stride, txfm_param->tx_type,
                    txfm_param->bd);
  }
}